

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::VirtualInputNodeTask::inputsAvailable
          (VirtualInputNodeTask *this,TaskInterface ti)

{
  BuildValue local_a8;
  ValueType local_38;
  VirtualInputNodeTask *local_20;
  VirtualInputNodeTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (VirtualInputNodeTask *)ti.impl;
  local_20 = this;
  llbuild::buildsystem::BuildValue::makeVirtualInput();
  llbuild::buildsystem::BuildValue::toData(&local_38,&local_a8);
  llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a8);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    ti.complete(BuildValue::makeVirtualInput().toData());
  }